

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

int motion_field_projection(AV1_COMMON *cm,MV_REFERENCE_FRAME start_frame,int dir)

{
  uint a;
  int iVar1;
  MV_REF *pMVar2;
  int iVar3;
  MV ref;
  int iVar4;
  RefCntBuffer *pRVar5;
  MV_REF *pMVar6;
  int in_EDX;
  AV1_COMMON *in_RDI;
  int mi_offset;
  int pos_valid;
  int ref_frame_offset;
  int mi_c;
  int mi_r;
  int_mv this_mv;
  MV fwd_mv;
  MV_REF *mv_ref;
  int blk_col;
  int blk_row;
  int mvs_cols;
  int mvs_rows;
  MV_REF *mv_ref_base;
  MV_REFERENCE_FRAME rf;
  int start_to_current_frame_offset;
  int cur_order_hint;
  uint *ref_order_hints;
  int start_frame_order_hint;
  RefCntBuffer *start_frame_buf;
  int ref_offset [8];
  TPL_MV_REF *tpl_mvs_base;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint local_a8;
  int local_a0;
  int local_9c;
  MV local_98;
  MV local_94;
  int blk_col_00;
  int blk_row_00;
  char local_69;
  int local_68;
  int local_48 [10];
  TPL_MV_REF *local_20;
  int local_18;
  AV1_COMMON *local_10;
  int local_4;
  
  local_20 = in_RDI->tpl_mvs;
  local_18 = in_EDX;
  local_10 = in_RDI;
  memset(local_48,0,0x20);
  pRVar5 = get_ref_frame_buf((AV1_COMMON *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4f);
  if (pRVar5 == (RefCntBuffer *)0x0) {
    local_4 = 0;
  }
  else if ((pRVar5->frame_type == '\0') || (pRVar5->frame_type == '\x02')) {
    local_4 = 0;
  }
  else if ((pRVar5->mi_rows == (local_10->mi_params).mi_rows) &&
          (pRVar5->mi_cols == (local_10->mi_params).mi_cols)) {
    a = pRVar5->order_hint;
    local_68 = get_relative_dist(&local_10->seq_params->order_hint_info,a,
                                 local_10->cur_frame->order_hint);
    for (local_69 = '\x01'; local_69 < '\b'; local_69 = local_69 + '\x01') {
      iVar3 = get_relative_dist(&local_10->seq_params->order_hint_info,a,
                                pRVar5->ref_order_hints[local_69 + -1]);
      local_48[local_69] = iVar3;
    }
    if (local_18 == 2) {
      local_68 = -local_68;
    }
    pMVar2 = pRVar5->mvs;
    ref = (MV)((local_10->mi_params).mi_rows + 1 >> 1);
    iVar3 = (local_10->mi_params).mi_cols + 1 >> 1;
    for (blk_row_00 = 0; blk_row_00 < (int)ref; blk_row_00 = blk_row_00 + 1) {
      for (blk_col_00 = 0; blk_col_00 < iVar3; blk_col_00 = blk_col_00 + 1) {
        pMVar6 = pMVar2 + (blk_row_00 * iVar3 + blk_col_00);
        local_94 = (pMVar6->mv).as_mv;
        if ('\0' < pMVar6->ref_frame) {
          iVar1 = local_48[pMVar6->ref_frame];
          iVar4 = iVar1;
          if (iVar1 < 1) {
            iVar4 = -iVar1;
          }
          local_a8 = 0;
          if ((iVar4 < 0x20) && (local_a8 = 0, 0 < iVar1)) {
            iVar4 = local_68;
            if (local_68 < 1) {
              iVar4 = -local_68;
            }
            local_a8 = (uint)(iVar4 < 0x20) << 0x18;
          }
          local_a8 = local_a8 >> 0x18;
          if (local_a8 != 0) {
            get_mv_projection((MV *)CONCAT44(blk_row_00,blk_col_00),ref,(int)((ulong)pMVar6 >> 0x20)
                              ,(int)pMVar6);
            local_a8 = get_block_position(local_10,&local_9c,&local_a0,blk_row_00,blk_col_00,
                                          local_98,local_18 >> 1);
          }
          if (local_a8 != 0) {
            iVar4 = local_9c * ((local_10->mi_params).mi_stride >> 1) + local_a0;
            local_20[iVar4].mfmv0.as_mv.row = local_94.row;
            local_20[iVar4].mfmv0.as_mv.col = local_94.col;
            local_20[iVar4].ref_frame_offset = (uint8_t)iVar1;
          }
        }
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int motion_field_projection(AV1_COMMON *cm,
                                   MV_REFERENCE_FRAME start_frame, int dir) {
  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int ref_offset[REF_FRAMES] = { 0 };

  const RefCntBuffer *const start_frame_buf =
      get_ref_frame_buf(cm, start_frame);
  if (start_frame_buf == NULL) return 0;

  if (start_frame_buf->frame_type == KEY_FRAME ||
      start_frame_buf->frame_type == INTRA_ONLY_FRAME)
    return 0;

  if (start_frame_buf->mi_rows != cm->mi_params.mi_rows ||
      start_frame_buf->mi_cols != cm->mi_params.mi_cols)
    return 0;

  const int start_frame_order_hint = start_frame_buf->order_hint;
  const unsigned int *const ref_order_hints =
      &start_frame_buf->ref_order_hints[0];
  const int cur_order_hint = cm->cur_frame->order_hint;
  int start_to_current_frame_offset = get_relative_dist(
      &cm->seq_params->order_hint_info, start_frame_order_hint, cur_order_hint);

  for (MV_REFERENCE_FRAME rf = LAST_FRAME; rf <= INTER_REFS_PER_FRAME; ++rf) {
    ref_offset[rf] = get_relative_dist(&cm->seq_params->order_hint_info,
                                       start_frame_order_hint,
                                       ref_order_hints[rf - LAST_FRAME]);
  }

  if (dir == 2) start_to_current_frame_offset = -start_to_current_frame_offset;

  MV_REF *mv_ref_base = start_frame_buf->mvs;
  const int mvs_rows = (cm->mi_params.mi_rows + 1) >> 1;
  const int mvs_cols = (cm->mi_params.mi_cols + 1) >> 1;

  for (int blk_row = 0; blk_row < mvs_rows; ++blk_row) {
    for (int blk_col = 0; blk_col < mvs_cols; ++blk_col) {
      MV_REF *mv_ref = &mv_ref_base[blk_row * mvs_cols + blk_col];
      MV fwd_mv = mv_ref->mv.as_mv;

      if (mv_ref->ref_frame > INTRA_FRAME) {
        int_mv this_mv;
        int mi_r, mi_c;
        const int ref_frame_offset = ref_offset[mv_ref->ref_frame];

        int pos_valid =
            abs(ref_frame_offset) <= MAX_FRAME_DISTANCE &&
            ref_frame_offset > 0 &&
            abs(start_to_current_frame_offset) <= MAX_FRAME_DISTANCE;

        if (pos_valid) {
          get_mv_projection(&this_mv.as_mv, fwd_mv,
                            start_to_current_frame_offset, ref_frame_offset);
          pos_valid = get_block_position(cm, &mi_r, &mi_c, blk_row, blk_col,
                                         this_mv.as_mv, dir >> 1);
        }

        if (pos_valid) {
          const int mi_offset = mi_r * (cm->mi_params.mi_stride >> 1) + mi_c;

          tpl_mvs_base[mi_offset].mfmv0.as_mv.row = fwd_mv.row;
          tpl_mvs_base[mi_offset].mfmv0.as_mv.col = fwd_mv.col;
          tpl_mvs_base[mi_offset].ref_frame_offset = ref_frame_offset;
        }
      }
    }
  }

  return 1;
}